

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausProcessClausesCut(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint **ppuVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  uint Matrix [32];
  uint *pSims [16];
  
  uVar2 = *(uint *)&pCut->field_0x4;
  if (0x5fffffff < uVar2 + 0xc0000000) {
    __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                  ,0xd1,
                  "int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  iVar3 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar9 = iVar3 - iVar1;
  if ((uVar9 & 7) == 0) {
    for (uVar5 = 0; uVar2 >> 0x1d != uVar5; uVar5 = uVar5 + 1) {
      pSims[uVar5] = (uint *)((long)&pSimMan[1].pAig +
                             (long)pCut->pLeaves[uVar5] * (long)iVar3 * 4 + (long)iVar1 * 4);
    }
    pScores[0xc] = 0;
    pScores[0xd] = 0;
    pScores[0xe] = 0;
    pScores[0xf] = 0;
    pScores[8] = 0;
    pScores[9] = 0;
    pScores[10] = 0;
    pScores[0xb] = 0;
    pScores[4] = 0;
    pScores[5] = 0;
    pScores[6] = 0;
    pScores[7] = 0;
    pScores[0] = 0;
    pScores[1] = 0;
    pScores[2] = 0;
    pScores[3] = 0;
    uVar9 = (int)uVar9 >> 3;
    uVar10 = 0;
    uVar5 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar5 = uVar10;
    }
    for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      Matrix[0x1c] = 0;
      Matrix[0x1d] = 0;
      Matrix[0x1e] = 0;
      Matrix[0x1f] = 0;
      Matrix[0x18] = 0;
      Matrix[0x19] = 0;
      Matrix[0x1a] = 0;
      Matrix[0x1b] = 0;
      Matrix[0x14] = 0;
      Matrix[0x15] = 0;
      Matrix[0x16] = 0;
      Matrix[0x17] = 0;
      Matrix[0x10] = 0;
      Matrix[0x11] = 0;
      Matrix[0x12] = 0;
      Matrix[0x13] = 0;
      Matrix[0xc] = 0;
      Matrix[0xd] = 0;
      Matrix[0xe] = 0;
      Matrix[0xf] = 0;
      Matrix[8] = 0;
      Matrix[9] = 0;
      Matrix[10] = 0;
      Matrix[0xb] = 0;
      Matrix[4] = 0;
      Matrix[5] = 0;
      Matrix[6] = 0;
      Matrix[7] = 0;
      Matrix[0] = 0;
      Matrix[1] = 0;
      Matrix[2] = 0;
      Matrix[3] = 0;
      uVar2 = *(uint *)&pCut->field_0x4;
      puVar4 = Matrix + 0x1f;
      for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
        ppuVar7 = pSims;
        for (lVar8 = 0; -lVar8 != (ulong)(uVar2 >> 0x1d); lVar8 = lVar8 + -1) {
          puVar4[lVar8] = (*ppuVar7)[uVar6 | uVar10 * 8];
          ppuVar7 = ppuVar7 + 1;
        }
        puVar4 = puVar4 + -4;
      }
      transpose32a(Matrix);
      for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
        uVar2 = Matrix[lVar8];
        iVar3 = 8;
        while (bVar11 = iVar3 != 0, iVar3 = iVar3 + -1, bVar11) {
          pScores[uVar2 & 0xf] = pScores[uVar2 & 0xf] + 1;
          uVar2 = uVar2 >> 4;
        }
      }
    }
    uVar2 = 0;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      uVar9 = 1 << ((byte)lVar8 & 0x1f);
      if (pScores[lVar8] == 0) {
        uVar9 = 0;
      }
      uVar2 = uVar2 | uVar9;
    }
    return uVar2;
  }
  __assert_fail("nWordsForSim % 8 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                ,0xd2,"int Fra_ClausProcessClausesCut(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)"
               );
}

Assistant:

int Fra_ClausProcessClausesCut( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned Matrix[32];
    unsigned * pSims[16], uWord;
    int nSeries, i, k, j;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    nSeries = nWordsForSim / 8;
    for ( i = 0; i < nSeries; i++ )
    {
        memset( Matrix, 0, sizeof(unsigned) * 32 );
        for ( k = 0; k < 8; k++ )
            for ( j = 0; j < (int)pCut->nLeaves; j++ )
                Matrix[31-(k*4+j)] = pSims[j][i*8+k];
        transpose32a( Matrix );
        for ( k = 0; k < 32; k++ )
            for ( j = 0, uWord = Matrix[k]; j < 8; j++, uWord >>= 4 )
                pScores[uWord & 0xF]++;
    }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}